

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<void> __thiscall
kj::Promise<void>::attach<kj::_::Deferred<kj::Function<void()>>>
          (Promise<void> *this,Deferred<kj::Function<void_()>_> *attachments)

{
  PromiseNode *pPVar1;
  Maybe<kj::Function<void_()>_> *in_RDX;
  PromiseNode *local_40;
  Deferred<kj::Function<void_()>_> local_38;
  
  Maybe<kj::Function<void_()>_>::Maybe(&local_38.maybeFunc,in_RDX);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void()>>>,kj::_::PromiseDisposer,kj::_::Deferred<kj::Function<void()>>>
            ((PromiseDisposer *)&local_40,(OwnPromiseNode *)attachments,&local_38);
  pPVar1 = local_40;
  local_40 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar1;
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred(&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}